

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

CFeeRate wallet::GetMinimumFeeRate
                   (CWallet *wallet,CCoinControl *coin_control,FeeCalculation *feeCalc)

{
  long lVar1;
  bool bVar2;
  CFeeRate *pCVar3;
  uint *puVar4;
  Chain *pCVar5;
  CAmount CVar6;
  CFeeRate CVar7;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool conservative_estimate;
  uint target;
  CFeeRate required_feerate;
  CFeeRate min_mempool_feerate;
  CFeeRate feerate_needed;
  optional<CFeeRate> *in_stack_ffffffffffffff78;
  CFeeRate *in_stack_ffffffffffffff80;
  CWallet *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar8;
  bool local_5e;
  byte local_5d;
  CAmount local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CFeeRate::CFeeRate((CFeeRate *)in_stack_ffffffffffffff78);
  bVar2 = std::optional::operator_cast_to_bool(in_stack_ffffffffffffff78);
  if (bVar2) {
    pCVar3 = std::optional<CFeeRate>::operator*(in_stack_ffffffffffffff78);
    local_10 = pCVar3->nSatoshisPerK;
    if (in_RDX != 0) {
      *(undefined4 *)(in_RDX + 0x70) = 6;
    }
    if ((*(byte *)(in_RSI + 0x5b) & 1) != 0) goto LAB_004bb69d;
  }
  else {
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_int> *)in_stack_ffffffffffffff78);
    local_5e = false;
    if (!bVar2) {
      CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffff78,0);
      local_5e = ::operator!=((CFeeRate *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    if (local_5e == false) {
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional<unsigned_int> *)in_stack_ffffffffffffff78);
      if (bVar2) {
        puVar4 = _GLOBAL__N_1::std::optional<unsigned_int>::operator*
                           ((optional<unsigned_int> *)in_stack_ffffffffffffff78);
        uVar8 = *puVar4;
      }
      else {
        uVar8 = *(uint *)(in_RDI + 0x390);
      }
      bVar2 = std::optional<bool>::value_or<bool_const&>
                        ((optional<bool> *)CONCAT44(uVar8,in_stack_ffffffffffffff90),
                         (bool *)in_stack_ffffffffffffff88);
      local_5d = (bVar2 ^ 0xffU) & 1;
      if (*(int *)(in_RSI + 0x7c) == 2) {
        local_5d = 1;
      }
      else if (*(int *)(in_RSI + 0x7c) == 1) {
        local_5d = 0;
      }
      pCVar5 = CWallet::chain(in_stack_ffffffffffffff88);
      local_10 = (**(code **)(*(long *)pCVar5 + 0xd8))(pCVar5,uVar8,local_5d,in_RDX);
      CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffff78,0);
      bVar2 = ::operator==((CFeeRate *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if (bVar2) {
        local_10 = *(CAmount *)(in_RDI + 0x3a0);
        if (in_RDX != 0) {
          *(undefined4 *)(in_RDX + 0x70) = 7;
        }
        in_stack_ffffffffffffff88 = (CWallet *)(in_RDI + 0x3a0);
        CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffff78,0);
        bVar2 = ::operator==((CFeeRate *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        if (bVar2) goto LAB_004bb69d;
      }
      pCVar5 = CWallet::chain(in_stack_ffffffffffffff88);
      CVar6 = (**(code **)(*(long *)pCVar5 + 0xe8))();
      bVar2 = ::operator<((CFeeRate *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if ((bVar2) && (local_10 = CVar6, in_RDX != 0)) {
        *(undefined4 *)(in_RDX + 0x70) = 5;
      }
    }
    else {
      local_10 = *(CAmount *)(in_RDI + 0x388);
      if (in_RDX != 0) {
        *(undefined4 *)(in_RDX + 0x70) = 6;
      }
    }
  }
  CVar7 = GetRequiredFeeRate(in_stack_ffffffffffffff88);
  bVar2 = operator>((CFeeRate *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if ((bVar2) && (local_10 = CVar7.nSatoshisPerK, in_RDX != 0)) {
    *(undefined4 *)(in_RDX + 0x70) = 8;
  }
LAB_004bb69d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (CFeeRate)local_10;
}

Assistant:

CFeeRate GetMinimumFeeRate(const CWallet& wallet, const CCoinControl& coin_control, FeeCalculation* feeCalc)
{
    /* User control of how to calculate fee uses the following parameter precedence:
       1. coin_control.m_feerate
       2. coin_control.m_confirm_target
       3. m_pay_tx_fee (user-set member variable of wallet)
       4. m_confirm_target (user-set member variable of wallet)
       The first parameter that is set is used.
    */
    CFeeRate feerate_needed;
    if (coin_control.m_feerate) { // 1.
        feerate_needed = *(coin_control.m_feerate);
        if (feeCalc) feeCalc->reason = FeeReason::PAYTXFEE;
        // Allow to override automatic min/max check over coin control instance
        if (coin_control.fOverrideFeeRate) return feerate_needed;
    }
    else if (!coin_control.m_confirm_target && wallet.m_pay_tx_fee != CFeeRate(0)) { // 3. TODO: remove magic value of 0 for wallet member m_pay_tx_fee
        feerate_needed = wallet.m_pay_tx_fee;
        if (feeCalc) feeCalc->reason = FeeReason::PAYTXFEE;
    }
    else { // 2. or 4.
        // We will use smart fee estimation
        unsigned int target = coin_control.m_confirm_target ? *coin_control.m_confirm_target : wallet.m_confirm_target;
        // By default estimates are economical iff we are signaling opt-in-RBF
        bool conservative_estimate = !coin_control.m_signal_bip125_rbf.value_or(wallet.m_signal_rbf);
        // Allow to override the default fee estimate mode over the CoinControl instance
        if (coin_control.m_fee_mode == FeeEstimateMode::CONSERVATIVE) conservative_estimate = true;
        else if (coin_control.m_fee_mode == FeeEstimateMode::ECONOMICAL) conservative_estimate = false;

        feerate_needed = wallet.chain().estimateSmartFee(target, conservative_estimate, feeCalc);
        if (feerate_needed == CFeeRate(0)) {
            // if we don't have enough data for estimateSmartFee, then use fallback fee
            feerate_needed = wallet.m_fallback_fee;
            if (feeCalc) feeCalc->reason = FeeReason::FALLBACK;

            // directly return if fallback fee is disabled (feerate 0 == disabled)
            if (wallet.m_fallback_fee == CFeeRate(0)) return feerate_needed;
        }
        // Obey mempool min fee when using smart fee estimation
        CFeeRate min_mempool_feerate = wallet.chain().mempoolMinFee();
        if (feerate_needed < min_mempool_feerate) {
            feerate_needed = min_mempool_feerate;
            if (feeCalc) feeCalc->reason = FeeReason::MEMPOOL_MIN;
        }
    }

    // prevent user from paying a fee below the required fee rate
    CFeeRate required_feerate = GetRequiredFeeRate(wallet);
    if (required_feerate > feerate_needed) {
        feerate_needed = required_feerate;
        if (feeCalc) feeCalc->reason = FeeReason::REQUIRED;
    }
    return feerate_needed;
}